

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int __thiscall QString::remove(QString *this,char *__filename)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EDX;
  long in_FS_OFFSET;
  char16_t *s;
  QVarLengthArray<char16_t,_256LL> *this_00;
  QString *in_stack_fffffffffffffd58;
  char16_t *str;
  QStringView *this_01;
  int iVar3;
  char16_t **in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd90;
  QVarLengthArray<char16_t,_256LL> *this_02;
  QStringView local_238;
  QVarLengthArray<char16_t,_256LL> *local_228;
  char16_t local_220 [46];
  CaseSensitivity in_stack_fffffffffffffe3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = (QVarLengthArray<char16_t,_256LL> *)this;
  local_228 = (QVarLengthArray<char16_t,_256LL> *)
              QArrayDataPointer<char16_t>::data((QArrayDataPointer<char16_t> *)__filename);
  bVar2 = QtPrivate::q_points_into_range<QArrayDataPointer<char16_t>,char16_t_const*>
                    (in_stack_fffffffffffffd80,&this->d);
  iVar3 = (int)this;
  if (bVar2) {
    this_00 = local_228;
    size((QString *)__filename);
    str = local_220;
    QVarLengthArray<char16_t,_256LL>::QVarLengthArray<const_char16_t_*,_true>
              (this_02,(char16_t *)__filename,(char16_t *)CONCAT44(in_EDX,in_stack_fffffffffffffd90)
              );
    this_01 = &local_238;
    std::data<QVarLengthArray<char16_t,256ll>>((QVarLengthArray<char16_t,_256LL> *)0x50ae03);
    QtPrivate::lengthHelperContainer<QVarLengthArray<char16_t,256ll>>
              ((QVarLengthArray<char16_t,_256LL> *)0x50ae12);
    QStringView::QStringView<char16_t,_true>(this_01,str,(qsizetype)this_00);
    removeStringImpl<QStringView>
              ((QString *)this_02,(QStringView *)__filename,in_stack_fffffffffffffe3c);
    QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(this_00);
  }
  else {
    qToStringViewIgnoringNull<QString,_true>(in_stack_fffffffffffffd58);
    removeStringImpl<QStringView>
              ((QString *)this_02,(QStringView *)__filename,in_stack_fffffffffffffe3c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::remove(const QString &str, Qt::CaseSensitivity cs)
{
    const auto s = str.d.data();
    if (QtPrivate::q_points_into_range(s, d))
        removeStringImpl(*this, QStringView{QVarLengthArray(s, s + str.size())}, cs);
    else
        removeStringImpl(*this, qToStringViewIgnoringNull(str), cs);
    return *this;
}